

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O1

void SHA384_512ProcessMessageBlock(SHA512Context *context)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  long lVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  ulong uVar20;
  long lVar21;
  uint64_t uVar22;
  ulong auStack_338 [4];
  ulong auStack_311 [4];
  long local_2f0 [5];
  ulong local_2c8 [83];
  
  lVar11 = 0x59;
  do {
    uVar1 = *(ulong *)((long)context->Intermediate_Hash + lVar11 + -7);
    *(ulong *)((long)auStack_311 + lVar11) =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0xd9);
  lVar11 = 0x10;
  do {
    uVar1 = local_2c8[lVar11];
    uVar2 = auStack_338[lVar11 + 1];
    local_2c8[lVar11 + 2] =
         (uVar1 >> 6 ^ (uVar1 << 3 | uVar1 >> 0x3d) ^ (uVar1 << 0x2d | uVar1 >> 0x13)) +
         local_2f0[lVar11] + auStack_338[lVar11] +
         (uVar2 >> 7 ^
         (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f));
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x50);
  uVar3 = context->Intermediate_Hash[1];
  uVar1 = context->Intermediate_Hash[2];
  uVar2 = context->Intermediate_Hash[3];
  uVar4 = context->Intermediate_Hash[4];
  uVar5 = context->Intermediate_Hash[5];
  uVar6 = context->Intermediate_Hash[6];
  uVar7 = context->Intermediate_Hash[7];
  lVar11 = 0;
  uVar8 = uVar5;
  uVar14 = uVar4;
  uVar9 = uVar1;
  uVar16 = uVar2;
  uVar10 = uVar3;
  uVar19 = context->Intermediate_Hash[0];
  uVar12 = uVar6;
  uVar22 = uVar7;
  do {
    uVar20 = uVar12;
    uVar18 = uVar19;
    uVar17 = uVar10;
    uVar15 = uVar9;
    uVar13 = uVar14;
    uVar12 = uVar8;
    lVar21 = ((uVar12 ^ uVar20) & uVar13 ^ uVar20) + uVar22 +
             ((uVar13 << 0x17 | uVar13 >> 0x29) ^
             (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe)) +
             *(long *)((long)SHA384_512ProcessMessageBlock::K + lVar11) +
             *(long *)((long)local_2c8 + lVar11 + 0x10);
    uVar14 = uVar16 + lVar21;
    uVar19 = (uVar15 & uVar17 ^ (uVar15 ^ uVar17) & uVar18) +
             ((uVar18 << 0x19 | uVar18 >> 0x27) ^
             (uVar18 << 0x1e | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar21;
    lVar11 = lVar11 + 8;
    uVar8 = uVar13;
    uVar9 = uVar17;
    uVar16 = uVar15;
    uVar10 = uVar18;
    uVar22 = uVar20;
  } while (lVar11 != 0x280);
  context->Intermediate_Hash[0] = uVar19 + context->Intermediate_Hash[0];
  context->Intermediate_Hash[1] = uVar18 + uVar3;
  context->Intermediate_Hash[2] = uVar17 + uVar1;
  context->Intermediate_Hash[3] = uVar15 + uVar2;
  context->Intermediate_Hash[4] = uVar14 + uVar4;
  context->Intermediate_Hash[5] = uVar13 + uVar5;
  context->Intermediate_Hash[6] = uVar12 + uVar6;
  context->Intermediate_Hash[7] = uVar20 + uVar7;
  context->Message_Block_Index = 0;
  return;
}

Assistant:

static void SHA384_512ProcessMessageBlock(SHA512Context *context)
{
    /* Constants defined in FIPS-180-2, section 4.2.3 */
#ifdef USE_32BIT_ONLY
    static const uint32_t K[80 * 2] = {
        0x428A2F98, 0xD728AE22, 0x71374491, 0x23EF65CD, 0xB5C0FBCF,
        0xEC4D3B2F, 0xE9B5DBA5, 0x8189DBBC, 0x3956C25B, 0xF348B538,
        0x59F111F1, 0xB605D019, 0x923F82A4, 0xAF194F9B, 0xAB1C5ED5,
        0xDA6D8118, 0xD807AA98, 0xA3030242, 0x12835B01, 0x45706FBE,
        0x243185BE, 0x4EE4B28C, 0x550C7DC3, 0xD5FFB4E2, 0x72BE5D74,
        0xF27B896F, 0x80DEB1FE, 0x3B1696B1, 0x9BDC06A7, 0x25C71235,
        0xC19BF174, 0xCF692694, 0xE49B69C1, 0x9EF14AD2, 0xEFBE4786,
        0x384F25E3, 0x0FC19DC6, 0x8B8CD5B5, 0x240CA1CC, 0x77AC9C65,
        0x2DE92C6F, 0x592B0275, 0x4A7484AA, 0x6EA6E483, 0x5CB0A9DC,
        0xBD41FBD4, 0x76F988DA, 0x831153B5, 0x983E5152, 0xEE66DFAB,
        0xA831C66D, 0x2DB43210, 0xB00327C8, 0x98FB213F, 0xBF597FC7,
        0xBEEF0EE4, 0xC6E00BF3, 0x3DA88FC2, 0xD5A79147, 0x930AA725,
        0x06CA6351, 0xE003826F, 0x14292967, 0x0A0E6E70, 0x27B70A85,
        0x46D22FFC, 0x2E1B2138, 0x5C26C926, 0x4D2C6DFC, 0x5AC42AED,
        0x53380D13, 0x9D95B3DF, 0x650A7354, 0x8BAF63DE, 0x766A0ABB,
        0x3C77B2A8, 0x81C2C92E, 0x47EDAEE6, 0x92722C85, 0x1482353B,
        0xA2BFE8A1, 0x4CF10364, 0xA81A664B, 0xBC423001, 0xC24B8B70,
        0xD0F89791, 0xC76C51A3, 0x0654BE30, 0xD192E819, 0xD6EF5218,
        0xD6990624, 0x5565A910, 0xF40E3585, 0x5771202A, 0x106AA070,
        0x32BBD1B8, 0x19A4C116, 0xB8D2D0C8, 0x1E376C08, 0x5141AB53,
        0x2748774C, 0xDF8EEB99, 0x34B0BCB5, 0xE19B48A8, 0x391C0CB3,
        0xC5C95A63, 0x4ED8AA4A, 0xE3418ACB, 0x5B9CCA4F, 0x7763E373,
        0x682E6FF3, 0xD6B2B8A3, 0x748F82EE, 0x5DEFB2FC, 0x78A5636F,
        0x43172F60, 0x84C87814, 0xA1F0AB72, 0x8CC70208, 0x1A6439EC,
        0x90BEFFFA, 0x23631E28, 0xA4506CEB, 0xDE82BDE9, 0xBEF9A3F7,
        0xB2C67915, 0xC67178F2, 0xE372532B, 0xCA273ECE, 0xEA26619C,
        0xD186B8C7, 0x21C0C207, 0xEADA7DD6, 0xCDE0EB1E, 0xF57D4F7F,
        0xEE6ED178, 0x06F067AA, 0x72176FBA, 0x0A637DC5, 0xA2C898A6,
        0x113F9804, 0xBEF90DAE, 0x1B710B35, 0x131C471B, 0x28DB77F5,
        0x23047D84, 0x32CAAB7B, 0x40C72493, 0x3C9EBE0A, 0x15C9BEBC,
        0x431D67C4, 0x9C100D4C, 0x4CC5D4BE, 0xCB3E42B6, 0x597F299C,
        0xFC657E2A, 0x5FCB6FAB, 0x3AD6FAEC, 0x6C44198C, 0x4A475817
    };
    int     t, t2, t8;                  /* Loop counter */
    uint32_t  temp1[2], temp2[2],       /* Temporary word values */
        temp3[2], temp4[2], temp5[2];
    uint32_t  W[2 * 80];                  /* Word sequence */
    uint32_t  A[2], B[2], C[2], D[2],   /* Word buffers */
        E[2], F[2], G[2], H[2];

    /* Initialize the first 16 words in the array W */
    for (t = t2 = t8 = 0; t < 16; t++, t8 += 8) {
        W[t2++] = ((((uint32_t)context->Message_Block[t8])) << 24) |
            ((((uint32_t)context->Message_Block[t8 + 1])) << 16) |
            ((((uint32_t)context->Message_Block[t8 + 2])) << 8) |
            ((((uint32_t)context->Message_Block[t8 + 3])));
        W[t2++] = ((((uint32_t)context->Message_Block[t8 + 4])) << 24) |
            ((((uint32_t)context->Message_Block[t8 + 5])) << 16) |
            ((((uint32_t)context->Message_Block[t8 + 6])) << 8) |
            ((((uint32_t)context->Message_Block[t8 + 7])));
    }

    for (t = 16; t < 80; t++, t2 += 2) {
        /* W[t] = SHA512_sigma1(W[t-2]) + W[t-7] +
        SHA512_sigma0(W[t-15]) + W[t-16]; */
        uint32_t *Wt2 = &W[t2 - 2 * 2];
        uint32_t *Wt7 = &W[t2 - 7 * 2];
        uint32_t *Wt15 = &W[t2 - 15 * 2];
        uint32_t *Wt16 = &W[t2 - 16 * 2];
        SHA512_sigma1(Wt2, temp1);
        SHA512_ADD(temp1, Wt7, temp2);
        SHA512_sigma0(Wt15, temp1);
        SHA512_ADD(temp1, Wt16, temp3);
        SHA512_ADD(temp2, temp3, &W[t2]);
    }

    A[0] = context->Intermediate_Hash[0];
    A[1] = context->Intermediate_Hash[1];
    B[0] = context->Intermediate_Hash[2];
    B[1] = context->Intermediate_Hash[3];
    C[0] = context->Intermediate_Hash[4];
    C[1] = context->Intermediate_Hash[5];
    D[0] = context->Intermediate_Hash[6];
    D[1] = context->Intermediate_Hash[7];
    E[0] = context->Intermediate_Hash[8];
    E[1] = context->Intermediate_Hash[9];
    F[0] = context->Intermediate_Hash[10];
    F[1] = context->Intermediate_Hash[11];
    G[0] = context->Intermediate_Hash[12];
    G[1] = context->Intermediate_Hash[13];
    H[0] = context->Intermediate_Hash[14];
    H[1] = context->Intermediate_Hash[15];

    for (t = t2 = 0; t < 80; t++, t2 += 2) {
        /*
        * temp1 = H + SHA512_SIGMA1(E) + SHA_Ch(E,F,G) + K[t] + W[t];
        */
        SHA512_SIGMA1(E, temp1);
        SHA512_ADD(H, temp1, temp2);
        SHA_Ch(E, F, G, temp3);
        SHA512_ADD(temp2, temp3, temp4);
        SHA512_ADD(&K[t2], &W[t2], temp5);
        SHA512_ADD(temp4, temp5, temp1);
        /*
        * temp2 = SHA512_SIGMA0(A) + SHA_Maj(A,B,C);
        */
        SHA512_SIGMA0(A, temp3);
        SHA_Maj(A, B, C, temp4);
        SHA512_ADD(temp3, temp4, temp2);
        H[0] = G[0]; H[1] = G[1];
        G[0] = F[0]; G[1] = F[1];
        F[0] = E[0]; F[1] = E[1];
        SHA512_ADD(D, temp1, E);
        D[0] = C[0]; D[1] = C[1];
        C[0] = B[0]; C[1] = B[1];
        B[0] = A[0]; B[1] = A[1];
        SHA512_ADD(temp1, temp2, A);
    }

    SHA512_ADDTO2(&context->Intermediate_Hash[0], A);
    SHA512_ADDTO2(&context->Intermediate_Hash[2], B);
    SHA512_ADDTO2(&context->Intermediate_Hash[4], C);
    SHA512_ADDTO2(&context->Intermediate_Hash[6], D);
    SHA512_ADDTO2(&context->Intermediate_Hash[8], E);
    SHA512_ADDTO2(&context->Intermediate_Hash[10], F);
    SHA512_ADDTO2(&context->Intermediate_Hash[12], G);
    SHA512_ADDTO2(&context->Intermediate_Hash[14], H);

#else /* !USE_32BIT_ONLY */
    static const uint64_t K[80] = {
        0x428A2F98D728AE22ull, 0x7137449123EF65CDull, 0xB5C0FBCFEC4D3B2Full,
        0xE9B5DBA58189DBBCull, 0x3956C25BF348B538ull, 0x59F111F1B605D019ull,
        0x923F82A4AF194F9Bull, 0xAB1C5ED5DA6D8118ull, 0xD807AA98A3030242ull,
        0x12835B0145706FBEull, 0x243185BE4EE4B28Cull, 0x550C7DC3D5FFB4E2ull,
        0x72BE5D74F27B896Full, 0x80DEB1FE3B1696B1ull, 0x9BDC06A725C71235ull,
        0xC19BF174CF692694ull, 0xE49B69C19EF14AD2ull, 0xEFBE4786384F25E3ull,
        0x0FC19DC68B8CD5B5ull, 0x240CA1CC77AC9C65ull, 0x2DE92C6F592B0275ull,
        0x4A7484AA6EA6E483ull, 0x5CB0A9DCBD41FBD4ull, 0x76F988DA831153B5ull,
        0x983E5152EE66DFABull, 0xA831C66D2DB43210ull, 0xB00327C898FB213Full,
        0xBF597FC7BEEF0EE4ull, 0xC6E00BF33DA88FC2ull, 0xD5A79147930AA725ull,
        0x06CA6351E003826Full, 0x142929670A0E6E70ull, 0x27B70A8546D22FFCull,
        0x2E1B21385C26C926ull, 0x4D2C6DFC5AC42AEDull, 0x53380D139D95B3DFull,
        0x650A73548BAF63DEull, 0x766A0ABB3C77B2A8ull, 0x81C2C92E47EDAEE6ull,
        0x92722C851482353Bull, 0xA2BFE8A14CF10364ull, 0xA81A664BBC423001ull,
        0xC24B8B70D0F89791ull, 0xC76C51A30654BE30ull, 0xD192E819D6EF5218ull,
        0xD69906245565A910ull, 0xF40E35855771202Aull, 0x106AA07032BBD1B8ull,
        0x19A4C116B8D2D0C8ull, 0x1E376C085141AB53ull, 0x2748774CDF8EEB99ull,
        0x34B0BCB5E19B48A8ull, 0x391C0CB3C5C95A63ull, 0x4ED8AA4AE3418ACBull,
        0x5B9CCA4F7763E373ull, 0x682E6FF3D6B2B8A3ull, 0x748F82EE5DEFB2FCull,
        0x78A5636F43172F60ull, 0x84C87814A1F0AB72ull, 0x8CC702081A6439ECull,
        0x90BEFFFA23631E28ull, 0xA4506CEBDE82BDE9ull, 0xBEF9A3F7B2C67915ull,
        0xC67178F2E372532Bull, 0xCA273ECEEA26619Cull, 0xD186B8C721C0C207ull,
        0xEADA7DD6CDE0EB1Eull, 0xF57D4F7FEE6ED178ull, 0x06F067AA72176FBAull,
        0x0A637DC5A2C898A6ull, 0x113F9804BEF90DAEull, 0x1B710B35131C471Bull,
        0x28DB77F523047D84ull, 0x32CAAB7B40C72493ull, 0x3C9EBE0A15C9BEBCull,
        0x431D67C49C100D4Cull, 0x4CC5D4BECB3E42B6ull, 0x597F299CFC657E2Aull,
        0x5FCB6FAB3AD6FAECull, 0x6C44198C4A475817ull
    };
    int        t, t8;                   /* Loop counter */
    uint64_t   temp1, temp2;            /* Temporary word value */
    uint64_t   W[80];                   /* Word sequence */
    uint64_t   A, B, C, D, E, F, G, H;  /* Word buffers */

    /*
    * Initialize the first 16 words in the array W
    */
    for (t = t8 = 0; t < 16; t++, t8 += 8)
        W[t] = ((uint64_t)(context->Message_Block[t8]) << 56) |
        ((uint64_t)(context->Message_Block[t8 + 1]) << 48) |
        ((uint64_t)(context->Message_Block[t8 + 2]) << 40) |
        ((uint64_t)(context->Message_Block[t8 + 3]) << 32) |
        ((uint64_t)(context->Message_Block[t8 + 4]) << 24) |
        ((uint64_t)(context->Message_Block[t8 + 5]) << 16) |
        ((uint64_t)(context->Message_Block[t8 + 6]) << 8) |
        ((uint64_t)(context->Message_Block[t8 + 7]));

    for (t = 16; t < 80; t++)
        W[t] = SHA512_sigma1(W[t - 2]) + W[t - 7] +
        SHA512_sigma0(W[t - 15]) + W[t - 16];

    A = context->Intermediate_Hash[0];
    B = context->Intermediate_Hash[1];
    C = context->Intermediate_Hash[2];
    D = context->Intermediate_Hash[3];
    E = context->Intermediate_Hash[4];
    F = context->Intermediate_Hash[5];
    G = context->Intermediate_Hash[6];
    H = context->Intermediate_Hash[7];

    for (t = 0; t < 80; t++) {
        temp1 = H + SHA512_SIGMA1(E) + SHA_Ch(E, F, G) + K[t] + W[t];
        temp2 = SHA512_SIGMA0(A) + SHA_Maj(A, B, C);
        H = G;
        G = F;
        F = E;
        E = D + temp1;
        D = C;
        C = B;
        B = A;
        A = temp1 + temp2;
    }

    context->Intermediate_Hash[0] += A;
    context->Intermediate_Hash[1] += B;
    context->Intermediate_Hash[2] += C;
    context->Intermediate_Hash[3] += D;
    context->Intermediate_Hash[4] += E;
    context->Intermediate_Hash[5] += F;
    context->Intermediate_Hash[6] += G;
    context->Intermediate_Hash[7] += H;
#endif /* USE_32BIT_ONLY */

    context->Message_Block_Index = 0;
}